

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O1

long decode_packed_entry_number(codebook *book,oggpack_buffer *b)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ogg_uint32_t *poVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  int bits;
  ulong uVar8;
  int iVar9;
  long unaff_R13;
  ogg_uint32_t *poVar10;
  
  bits = book->dec_maxlength;
  lVar3 = oggpack_look(b,book->dec_firsttablen);
  if (lVar3 < 0) {
    unaff_R13 = book->used_entries;
    poVar10 = (ogg_uint32_t *)0x0;
  }
  else {
    poVar4 = book->dec_firsttable;
    uVar2 = poVar4[lVar3];
    if ((int)uVar2 < 0) {
      poVar10 = (ogg_uint32_t *)(ulong)(uVar2 >> 0xf & 0x7fff);
      unaff_R13 = book->used_entries - (ulong)(uVar2 & 0x7fff);
    }
    else {
      poVar4 = (ogg_uint32_t *)((ulong)uVar2 - 1);
      oggpack_adv(b,(int)book->dec_codelengths[(ulong)uVar2 - 1]);
      poVar10 = poVar4;
    }
    if (-1 < (int)uVar2) {
      return (long)poVar4;
    }
  }
  lVar3 = oggpack_look(b,bits);
  iVar9 = bits;
  if (bits < 2 || -1 < lVar3) {
    bVar7 = (byte)((ulong)lVar3 >> 0x3f);
  }
  else {
    do {
      bits = iVar9 + -1;
      lVar3 = oggpack_look(b,bits);
      bVar7 = (byte)((ulong)lVar3 >> 0x3f);
      if (-1 < lVar3) break;
      bVar1 = 2 < iVar9;
      iVar9 = bits;
    } while (bVar1);
  }
  poVar4 = (ogg_uint32_t *)0xffffffffffffffff;
  if (bVar7 == 0) {
    uVar5 = unaff_R13 - (long)poVar10;
    poVar4 = poVar10;
    if (1 < (long)uVar5) {
      uVar2 = (uint)lVar3;
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = (uVar2 & 0xf0f0f0f) << 4 | uVar2 >> 4 & 0xf0f0f0f;
      uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333) * 4;
      do {
        uVar5 = uVar5 >> 1;
        if ((uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555) * 2 <
            book->codelist[(long)poVar4 + uVar5]) {
          uVar8 = 0;
          uVar6 = uVar5;
        }
        else {
          uVar6 = 0;
          uVar8 = uVar5;
        }
        unaff_R13 = unaff_R13 - uVar6;
        poVar4 = (ogg_uint32_t *)((long)poVar4 + uVar8);
        uVar5 = unaff_R13 - (long)poVar4;
      } while (1 < (long)uVar5);
    }
    if (bits < book->dec_codelengths[(long)poVar4]) {
      oggpack_adv(b,bits);
      poVar4 = (ogg_uint32_t *)0xffffffffffffffff;
    }
    else {
      oggpack_adv(b,(int)book->dec_codelengths[(long)poVar4]);
    }
  }
  return (long)poVar4;
}

Assistant:

STIN long decode_packed_entry_number(codebook *book, oggpack_buffer *b){
  int  read=book->dec_maxlength;
  long lo,hi;
  long lok = oggpack_look(b,book->dec_firsttablen);

  if (lok >= 0) {
    long entry = book->dec_firsttable[lok];
    if(entry&0x80000000UL){
      lo=(entry>>15)&0x7fff;
      hi=book->used_entries-(entry&0x7fff);
    }else{
      oggpack_adv(b, book->dec_codelengths[entry-1]);
      return(entry-1);
    }
  }else{
    lo=0;
    hi=book->used_entries;
  }

  /* Single entry codebooks use a firsttablen of 1 and a
     dec_maxlength of 1.  If a single-entry codebook gets here (due to
     failure to read one bit above), the next look attempt will also
     fail and we'll correctly kick out instead of trying to walk the
     underformed tree */

  lok = oggpack_look(b, read);

  while(lok<0 && read>1)
    lok = oggpack_look(b, --read);
  if(lok<0)return -1;

  /* bisect search for the codeword in the ordered list */
  {
    ogg_uint32_t testword=bitreverse((ogg_uint32_t)lok);

    while(hi-lo>1){
      long p=(hi-lo)>>1;
      long test=book->codelist[lo+p]>testword;
      lo+=p&(test-1);
      hi-=p&(-test);
      }

    if(book->dec_codelengths[lo]<=read){
      oggpack_adv(b, book->dec_codelengths[lo]);
      return(lo);
    }
  }

  oggpack_adv(b, read);

  return(-1);
}